

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall ncnn::Convolution::destroy_pipeline(Convolution *this,Option *opt)

{
  Layer *pLVar1;
  pointer pfVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  long lVar5;
  
  pLVar1 = this->quantize;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->quantize != (Layer *)0x0) {
      (*this->quantize->_vptr_Layer[1])();
    }
    this->quantize = (Layer *)0x0;
  }
  ppLVar3 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar4 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3)) {
    lVar5 = 0;
    do {
      (*ppLVar3[lVar5]->_vptr_Layer[5])(ppLVar3[lVar5],opt);
      ppLVar3 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppLVar3[lVar5] != (Layer *)0x0) {
        (*ppLVar3[lVar5]->_vptr_Layer[1])();
        ppLVar3 = (this->dequantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar5 = lVar5 + 1;
      ppLVar4 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar5 < (int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3));
  }
  if (ppLVar4 != ppLVar3) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar3;
  }
  ppLVar3 = (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar4 = (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3)) {
    lVar5 = 0;
    do {
      (*ppLVar3[lVar5]->_vptr_Layer[5])(ppLVar3[lVar5],opt);
      ppLVar3 = (this->requantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppLVar3[lVar5] != (Layer *)0x0) {
        (*ppLVar3[lVar5]->_vptr_Layer[1])();
        ppLVar3 = (this->requantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar5 = lVar5 + 1;
      ppLVar4 = (this->requantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar5 < (int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3));
  }
  if (ppLVar4 != ppLVar3) {
    (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar3;
  }
  pfVar2 = (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  return 0;
}

Assistant:

int Convolution::destroy_pipeline(const Option& opt)
{
    if (quantize)
    {
        quantize->destroy_pipeline(opt);
        delete quantize;
        quantize = 0;
    }

    for (int i=0; i<(int)dequantize_ops.size(); i++)
    {
        dequantize_ops[i]->destroy_pipeline(opt);
        delete dequantize_ops[i];
    }
    dequantize_ops.clear();

    for (int i=0; i<(int)requantize_ops.size(); i++)
    {
        requantize_ops[i]->destroy_pipeline(opt);
        delete requantize_ops[i];
    }
    requantize_ops.clear();

    dequantize_scales.clear();
    requantize_scales.clear();

    return 0;
}